

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O0

int AF_A_FreezeDeathChunks(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  AActor *pAVar4;
  FState *pFVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  VMValue *local_168;
  bool local_126;
  bool local_123;
  FName local_120;
  TFlags<ActorFlag4,_unsigned_int> local_11c;
  DVector3 local_118;
  FName local_fc;
  APlayerPawn *local_f8;
  AActor *head;
  VMValue *local_e0;
  undefined1 local_d8 [8];
  VMValue params [3];
  FName local_84;
  double local_80;
  double zo;
  double yo;
  double xo;
  AActor *local_60;
  AActor *mo;
  int numChunks;
  int i;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_20;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pVStack_20 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_shared/a_action.cpp"
                  ,0x10f,
                  "int AF_A_FreezeDeathChunks(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar6 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar6 = true, (param->field_0).field_1.atag != 1)) {
    bVar6 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar6) {
    stateowner = (AActor *)(param->field_0).field_1.a;
    local_123 = true;
    if (stateowner != (AActor *)0x0) {
      local_123 = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
    }
    if (local_123 != false) {
      self._0_4_ = (int)self + 1;
      if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
        bVar6 = false;
        if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
           (bVar6 = true, pVStack_20[(int)self].field_0.field_1.atag != 1)) {
          bVar6 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar6) {
          __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_shared/a_action.cpp"
                        ,0x10f,
                        "int AF_A_FreezeDeathChunks(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                       );
        }
        stateinfo = (FStateParamInfo *)pVStack_20[(int)self].field_0.field_1.a;
        local_126 = true;
        if ((DObject *)stateinfo != (DObject *)0x0) {
          local_126 = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
        }
        if (local_126 == false) {
          __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_shared/a_action.cpp"
                        ,0x10f,
                        "int AF_A_FreezeDeathChunks(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                       );
        }
      }
      else {
        stateinfo = (FStateParamInfo *)stateowner;
      }
      self._0_4_ = (int)self + 1;
      if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
        bVar6 = false;
        if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
           (bVar6 = true, pVStack_20[(int)self].field_0.field_1.atag != 8)) {
          bVar6 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar6) {
          __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_shared/a_action.cpp"
                        ,0x10f,
                        "int AF_A_FreezeDeathChunks(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                       );
        }
        _numChunks = pVStack_20[(int)self].field_0.field_1.a;
      }
      else {
        _numChunks = (void *)0x0;
      }
      bVar1 = TVector3<double>::isZero(&stateowner->Vel);
      bVar6 = false;
      if (!bVar1) {
        TFlags<ActorFlag6,_unsigned_int>::operator&
                  ((TFlags<ActorFlag6,_unsigned_int> *)((long)&xo + 4),
                   (int)stateowner + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_BUMPSPECIAL));
        uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&xo + 4));
        bVar6 = uVar2 == 0;
      }
      if (bVar6) {
        stateowner->tics = 0x69;
      }
      else {
        TVector3<double>::Zero(&stateowner->Vel);
        pAVar4 = stateowner;
        FSoundID::FSoundID((FSoundID *)&xo,"misc/icebreak");
        S_Sound(pAVar4,4,(FSoundID *)&xo,1.0,1.0);
        mo._0_4_ = MAX<int>(4,(int)(stateowner->radius * stateowner->Height) / 0x20);
        iVar3 = FRandom::Random2(&pr_freeze);
        mo._4_4_ = iVar3 % ((int)mo / 4);
        for (mo._4_4_ = MAX<int>(0x18,(int)mo + mo._4_4_); -1 < mo._4_4_; mo._4_4_ = mo._4_4_ + -1)
        {
          iVar3 = FRandom::operator()(&pr_freeze);
          yo = ((double)(iVar3 + -0x80) * stateowner->radius) / 128.0;
          iVar3 = FRandom::operator()(&pr_freeze);
          zo = ((double)(iVar3 + -0x80) * stateowner->radius) / 128.0;
          iVar3 = FRandom::operator()(&pr_freeze);
          local_80 = ((double)iVar3 * stateowner->Height) / 255.0;
          FName::FName(&local_84,"IceChunk");
          AActor::Vec3Offset((DVector3 *)&stack0xffffffffffffff60,stateowner,yo,zo,local_80,false);
          pAVar4 = Spawn(&local_84,(DVector3 *)&stack0xffffffffffffff60,ALLOW_REPLACE);
          local_60 = pAVar4;
          if (pAVar4 != (AActor *)0x0) {
            pFVar5 = pAVar4->SpawnState;
            iVar3 = FRandom::operator()(&pr_freeze);
            AActor::SetState(pAVar4,pFVar5 + iVar3 % 3,false);
            iVar3 = FRandom::Random2(&pr_freeze);
            (local_60->Vel).X = (double)iVar3 * 0.0078125;
            iVar3 = FRandom::Random2(&pr_freeze);
            (local_60->Vel).Y = (double)iVar3 * 0.0078125;
            dVar7 = AActor::Z(local_60);
            dVar8 = AActor::Z(stateowner);
            (local_60->Vel).Z = ((dVar7 - dVar8) / stateowner->Height) * 4.0;
            local_e0 = (VMValue *)local_d8;
            VMValue::VMValue(local_e0,(DObject *)local_60);
            local_e0 = (VMValue *)((long)&params[0].field_0 + 8);
            VMValue::VMValue(local_e0,(DObject *)local_60);
            local_e0 = (VMValue *)((long)&params[1].field_0 + 8);
            VMValue::VMValue(local_e0,(void *)0x0,8);
            VMFrameStack::Call((VMFrameStack *)param_local,&A_IceSetTics_VMPtr->super_VMFunction,
                               (VMValue *)local_d8,3,(VMReturn *)0x0,0,(VMException **)0x0);
            local_168 = (VMValue *)((long)&params[2].field_0 + 8);
            do {
              local_168 = local_168 + -1;
              VMValue::~VMValue(local_168);
            } while (local_168 != (VMValue *)local_d8);
            local_60->RenderStyle = stateowner->RenderStyle;
            local_60->Alpha = stateowner->Alpha;
          }
        }
        if (stateowner->player != (player_t *)0x0) {
          FName::FName(&local_fc,"IceChunkHead");
          AActor::PosPlusZ(&local_118,stateowner,stateowner->player->mo->ViewHeight);
          local_f8 = (APlayerPawn *)Spawn(&local_fc,&local_118,ALLOW_REPLACE);
          if (local_f8 != (APlayerPawn *)0x0) {
            iVar3 = FRandom::Random2(&pr_freeze);
            (local_f8->super_AActor).Vel.X = (double)iVar3 / 128.0;
            iVar3 = FRandom::Random2(&pr_freeze);
            (local_f8->super_AActor).Vel.Y = (double)iVar3 / 128.0;
            dVar7 = AActor::Z(local_60);
            dVar8 = AActor::Z(stateowner);
            (local_f8->super_AActor).Vel.Z = ((dVar7 - dVar8) / stateowner->Height) * 4.0;
            (local_f8->super_AActor).health = stateowner->health;
            TAngle<double>::operator=
                      (&(local_f8->super_AActor).Angles.Yaw,&(stateowner->Angles).Yaw);
            bVar6 = DObject::IsKindOf((DObject *)local_f8,APlayerPawn::RegistrationInfo.MyClass);
            if (bVar6) {
              *(player_t **)((long)(&(local_f8->super_AActor).super_DThinker + 9) + 8) =
                   stateowner->player;
              (*(player_t **)((long)(&(local_f8->super_AActor).super_DThinker + 9) + 8))->mo =
                   local_f8;
              stateowner->player = (player_t *)0x0;
              AActor::ObtainInventory(&local_f8->super_AActor,stateowner);
            }
            TAngle<double>::operator=(&(local_f8->super_AActor).Angles.Pitch,0.0);
            (local_f8->super_AActor).RenderStyle = stateowner->RenderStyle;
            (local_f8->super_AActor).Alpha = stateowner->Alpha;
            bVar6 = TObjPtr<AActor>::operator==
                              (&((local_f8->super_AActor).player)->camera,stateowner);
            if (bVar6) {
              TObjPtr<AActor>::operator=
                        (&((local_f8->super_AActor).player)->camera,&local_f8->super_AActor);
            }
          }
        }
        TFlags<ActorFlag4,_unsigned_int>::operator&
                  (&local_11c,
                   (int)stateowner +
                   (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_RANDOMIZE|MF4_BOSSDEATH));
        uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_11c);
        if (uVar2 != 0) {
          A_BossDeath(stateowner);
        }
        A_Unblock(stateowner,true);
        pAVar4 = stateowner;
        FName::FName(&local_120,NAME_Null);
        pFVar5 = AActor::FindState(pAVar4,&local_120);
        AActor::SetState(pAVar4,pFVar5,false);
      }
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_shared/a_action.cpp"
                  ,0x10f,
                  "int AF_A_FreezeDeathChunks(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_shared/a_action.cpp"
                ,0x10f,"int AF_A_FreezeDeathChunks(VMFrameStack *, VMValue *, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FreezeDeathChunks)
{
	PARAM_ACTION_PROLOGUE;

	int i;
	int numChunks;
	AActor *mo;
	
	if (!self->Vel.isZero() && !(self->flags6 & MF6_SHATTERING))
	{
		self->tics = 3*TICRATE;
		return 0;
	}
	self->Vel.Zero();
	S_Sound (self, CHAN_BODY, "misc/icebreak", 1, ATTN_NORM);

	// [RH] In Hexen, this creates a random number of shards (range [24,56])
	// with no relation to the size of the self shattering. I think it should
	// base the number of shards on the size of the dead thing, so bigger
	// things break up into more shards than smaller things.
	// An actor with radius 20 and height 64 creates ~40 chunks.
	numChunks = MAX<int>(4, int(self->radius * self->Height)/32);
	i = (pr_freeze.Random2()) % (numChunks/4);
	for (i = MAX (24, numChunks + i); i >= 0; i--)
	{
		double xo = (pr_freeze() - 128)*self->radius / 128;
		double yo = (pr_freeze() - 128)*self->radius / 128;
		double zo = (pr_freeze()*self->Height / 255);

		mo = Spawn("IceChunk", self->Vec3Offset(xo, yo, zo), ALLOW_REPLACE);
		if (mo)
		{
			mo->SetState (mo->SpawnState + (pr_freeze()%3));
			mo->Vel.X = pr_freeze.Random2() / 128.;
			mo->Vel.Y = pr_freeze.Random2() / 128.;
			mo->Vel.Z = (mo->Z() - self->Z()) / self->Height * 4;
			CALL_ACTION(A_IceSetTics, mo); // set a random tic wait
			mo->RenderStyle = self->RenderStyle;
			mo->Alpha = self->Alpha;
		}
	}
	if (self->player)
	{ // attach the player's view to a chunk of ice
		AActor *head = Spawn("IceChunkHead", self->PosPlusZ(self->player->mo->ViewHeight), ALLOW_REPLACE);
		if (head != NULL)
		{
			head->Vel.X = pr_freeze.Random2() / 128.;
			head->Vel.Y = pr_freeze.Random2() / 128.;
			head->Vel.Z = (mo->Z() - self->Z()) / self->Height * 4;

			head->health = self->health;
			head->Angles.Yaw = self->Angles.Yaw;
			if (head->IsKindOf(RUNTIME_CLASS(APlayerPawn)))
			{
				head->player = self->player;
				head->player->mo = static_cast<APlayerPawn*>(head);
				self->player = NULL;
				head->ObtainInventory (self);
			}
			head->Angles.Pitch = 0.;
			head->RenderStyle = self->RenderStyle;
			head->Alpha = self->Alpha;
			if (head->player->camera == self)
			{
				head->player->camera = head;
			}
		}
	}

	// [RH] Do some stuff to make this more useful outside Hexen
	if (self->flags4 & MF4_BOSSDEATH)
	{
		A_BossDeath(self);
	}
	A_Unblock(self, true);

	self->SetState(self->FindState(NAME_Null));
	return 0;
}